

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcMan.c
# Opt level: O0

Mvc_Manager_t * Mvc_ManagerStart(void)

{
  Mvc_Manager_t *__s;
  Extra_MmFixed_t *pEVar1;
  Mvc_Manager_t *p;
  
  __s = (Mvc_Manager_t *)malloc(0x20);
  memset(__s,0,0x20);
  pEVar1 = Extra_MmFixedStart(0x18);
  __s->pMan1 = pEVar1;
  pEVar1 = Extra_MmFixedStart(0x1c);
  __s->pMan2 = pEVar1;
  pEVar1 = Extra_MmFixedStart(0x24);
  __s->pMan4 = pEVar1;
  pEVar1 = Extra_MmFixedStart(0x50);
  __s->pManC = pEVar1;
  return __s;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Mvc_Manager_t * Mvc_ManagerStart()
{
    Mvc_Manager_t * p;
    p = ABC_ALLOC( Mvc_Manager_t, 1 );
    memset( p, 0, sizeof(Mvc_Manager_t) );
    p->pMan1 = Extra_MmFixedStart( sizeof(Mvc_Cube_t)                              );
    p->pMan2 = Extra_MmFixedStart( sizeof(Mvc_Cube_t) +     sizeof(Mvc_CubeWord_t) );
    p->pMan4 = Extra_MmFixedStart( sizeof(Mvc_Cube_t) + 3 * sizeof(Mvc_CubeWord_t) );
    p->pManC = Extra_MmFixedStart( sizeof(Mvc_Cover_t) );
    return p;
}